

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O2

void __thiscall Abstract<4U>::~Abstract(Abstract<4U> *this)

{
  this->_vptr_Abstract = (_func_int **)&PTR_Init_00112b68;
  std::__cxx11::string::~string((string *)&this->sep);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

void rename(int slot_num, int counter_num) {
		char* tp = new char[20];
		std::sprintf(tp, "WavingSketch<%d,%d>", slot_num, counter_num);
		name = tp;
	}